

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<std::vector<double,_std::allocator<double>_>_> * __thiscall
VW::config::typed_option<std::vector<double,_std::allocator<double>_>_>::value
          (typed_option<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *value)

{
  typed_option<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffe0;
  
  std::
  make_shared<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>&>
            (in_stack_00000008);
  std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::operator=
            (in_stack_ffffffffffffffe0,
             (shared_ptr<std::vector<double,_std::allocator<double>_>_> *)in_RDI);
  std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::~shared_ptr
            ((shared_ptr<std::vector<double,_std::allocator<double>_>_> *)0x34f360);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }